

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QString>::appendIteratorRange<QHash<QString,QSqlDatabase>::key_iterator>
          (QCommonArrayOps<QString> *this,key_iterator b,key_iterator e,
          IfIsForwardIterator<QHash<QString,_QSqlDatabase>::key_iterator> param_4)

{
  long lVar1;
  key_iterator o;
  key_iterator __last;
  key_iterator __first;
  bool bVar2;
  QString *pQVar3;
  size_t in_RCX;
  Data<QHashPrivate::Node<QString,_QSqlDatabase>_> *in_RDI;
  long in_FS_OFFSET;
  QString *iter;
  qsizetype distance;
  QString *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffffa8;
  Data<QHashPrivate::Node<QString,_QSqlDatabase>_> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first.i.i.bucket = in_RCX;
  __first.i.i.d = in_stack_ffffffffffffffb0;
  __last.i.i.bucket = in_stack_ffffffffffffffa8;
  __last.i.i.d = in_RDI;
  std::distance<QHash<QString,QSqlDatabase>::key_iterator>(__first,__last);
  pQVar3 = QArrayDataPointer<QString>::end((QArrayDataPointer<QString> *)in_RDI);
  while( true ) {
    o.i.i.bucket = (size_t)pQVar3;
    o.i.i.d = in_RDI;
    bVar2 = QHash<QString,_QSqlDatabase>::key_iterator::operator!=
                      ((key_iterator *)in_stack_ffffffffffffff78,o);
    in_stack_ffffffffffffff78 = pQVar3;
    if (!bVar2) break;
    pQVar3 = in_stack_ffffffffffffff78;
    QHash<QString,_QSqlDatabase>::key_iterator::operator*((key_iterator *)0x12382e);
    QString::QString((QString *)in_RDI,in_stack_ffffffffffffff78);
    in_RDI->numBuckets = in_RDI->numBuckets + 1;
    pQVar3 = pQVar3 + 1;
    QHash<QString,_QSqlDatabase>::key_iterator::operator++((key_iterator *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }